

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

uint Io_NtkWriteNodeGate(FILE *pFile,Abc_Obj_t *pNode)

{
  Mio_Gate_t *pGate_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  char *pcVar4;
  double dVar5;
  int local_2c;
  Mio_Pin_t *pMStack_28;
  int i;
  Mio_Pin_t *pGatePin;
  Mio_Gate_t *pGate;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  pGate_00 = (Mio_Gate_t *)(pNode->field_5).pData;
  pMStack_28 = Mio_GateReadPins(pGate_00);
  local_2c = 0;
  while (pMStack_28 != (Mio_Pin_t *)0x0) {
    pAVar2 = Abc_ObjFanin(pNode,local_2c);
    pcVar3 = Abc_ObjName(pAVar2);
    fprintf((FILE *)pFile,"%s_",pcVar3);
    pMStack_28 = Mio_PinReadNext(pMStack_28);
    local_2c = local_2c + 1;
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if (local_2c == iVar1) {
    pAVar2 = Abc_ObjFanout0(pNode);
    pcVar3 = Abc_ObjName(pAVar2);
    pcVar4 = Mio_GateReadName(pGate_00);
    fprintf((FILE *)pFile,"%s_%s\t",pcVar3,pcVar4);
    dVar5 = Mio_GateReadArea(pGate_00);
    return (uint)(long)dVar5;
  }
  __assert_fail("i == Abc_ObjFaninNum(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                ,0x183,"unsigned int Io_NtkWriteNodeGate(FILE *, Abc_Obj_t *)");
}

Assistant:

unsigned Io_NtkWriteNodeGate( FILE * pFile, Abc_Obj_t * pNode )
{
    Mio_Gate_t * pGate = (Mio_Gate_t *)pNode->pData;
    Mio_Pin_t * pGatePin;
    int i;
    // write the node gate
    for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        fprintf( pFile, "%s_", Abc_ObjName( Abc_ObjFanin(pNode,i) ) );
    assert ( i == Abc_ObjFaninNum(pNode) );
    fprintf( pFile, "%s_%s\t", Abc_ObjName( Abc_ObjFanout0(pNode) ), Mio_GateReadName(pGate) );
    return Mio_GateReadArea(pGate);
}